

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_cStreamStage ZVar1;
  ZSTD_bufferMode_e ZVar2;
  void *pvVar3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  size_t err_code;
  ulong uVar8;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  char *dst;
  size_t sVar14;
  void *pvVar15;
  void *src;
  char *dst_00;
  ulong uVar16;
  bool bVar17;
  ulong local_80;
  
  sVar13 = 0xffffffffffffffba;
  if (output->pos <= output->size) {
    sVar13 = 0xffffffffffffffb8;
    if ((input->pos <= input->size) &&
       (sVar13 = 0xffffffffffffffd6, endOp < (ZSTD_e_end|ZSTD_e_flush))) {
      if (cctx->streamStage == zcss_init) {
        sVar13 = ZSTD_CCtx_init_compressStream2(cctx,endOp,input->size);
        if (0xffffffffffffff88 < sVar13) {
          return sVar13;
        }
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
          (cctx->expectedInBuffer).pos = input->pos;
          uVar5 = *(undefined4 *)((long)&input->src + 4);
          sVar13 = input->size;
          uVar6 = *(undefined4 *)((long)&input->size + 4);
          *(undefined4 *)&(cctx->expectedInBuffer).src = *(undefined4 *)&input->src;
          *(undefined4 *)((long)&(cctx->expectedInBuffer).src + 4) = uVar5;
          *(int *)&(cctx->expectedInBuffer).size = (int)sVar13;
          *(undefined4 *)((long)&(cctx->expectedInBuffer).size + 4) = uVar6;
        }
        if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
          cctx->expectedOutBufferSize = output->size - output->pos;
        }
      }
      if (((cctx->appliedParams).inBufferMode != ZSTD_bm_stable) ||
         ((((sVar13 = 0xffffffffffffff97, (cctx->expectedInBuffer).src == input->src &&
            ((cctx->expectedInBuffer).pos == input->pos)) && (endOp == ZSTD_e_end)) &&
          ((cctx->expectedInBuffer).size == input->size)))) {
        if (((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) &&
           (bVar17 = cctx->expectedOutBufferSize != output->size - output->pos, bVar17)) {
          sVar13 = (ulong)bVar17 - 0x69;
        }
        else {
          sVar13 = 0;
        }
      }
      if (sVar13 < 0xffffffffffffff89) {
        pvVar3 = input->src;
        pvVar10 = (void *)(input->size + (long)pvVar3);
        pvVar15 = (void *)(input->pos + (long)pvVar3);
        pvVar4 = output->dst;
        sVar13 = output->size;
        dst_00 = (char *)(output->pos + (long)pvVar4);
        do {
          ZVar1 = cctx->streamStage;
          if (ZVar1 == zcss_load) {
            if (endOp == ZSTD_e_end) {
              sVar14 = (long)pvVar10 - (long)pvVar15;
              uVar8 = -(sVar14 - 0x20000) >> 0xb;
              if (0x1ffff < sVar14) {
                uVar8 = 0;
              }
              sVar11 = (long)pvVar4 + (sVar13 - (long)dst_00);
              if ((((sVar14 >> 8) + sVar14 + uVar8 <= sVar11) ||
                  ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable)) && (cctx->inBuffPos == 0)
                 ) {
                uVar8 = ZSTD_compressEnd(cctx,dst_00,sVar11,pvVar15,sVar14);
                if (0xffffffffffffff88 >= uVar8) {
                  dst_00 = dst_00 + uVar8;
                  cctx->streamStage = zcss_init;
                  cctx->frameEnded = 1;
                  cctx->pledgedSrcSizePlusOne = 0;
                  pvVar15 = pvVar10;
                  bVar17 = 0xffffffffffffff88 < uVar8;
                  goto LAB_0062f7f8;
                }
                goto LAB_0062f869;
              }
            }
            bVar17 = true;
            src = pvVar15;
            if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
              uVar12 = cctx->inBuffTarget - cctx->inBuffPos;
              uVar8 = (long)pvVar10 - (long)pvVar15;
              if (uVar12 < (ulong)((long)pvVar10 - (long)pvVar15)) {
                uVar8 = uVar12;
              }
              if (uVar8 != 0) {
                memcpy(cctx->inBuff + cctx->inBuffPos,pvVar15,uVar8);
              }
              uVar12 = cctx->inBuffPos + uVar8;
              cctx->inBuffPos = uVar12;
              if (endOp == ZSTD_e_flush) {
                bVar7 = false;
                bVar17 = false;
                if (uVar12 != cctx->inToCompress) goto LAB_0062f4d8;
              }
              else {
                if (endOp == ZSTD_e_continue) {
                  bVar7 = false;
                  bVar17 = false;
                  if (uVar12 < cctx->inBuffTarget) goto LAB_0062f4e0;
                }
LAB_0062f4d8:
                bVar17 = true;
                bVar7 = true;
              }
LAB_0062f4e0:
              pvVar15 = (void *)((long)pvVar15 + uVar8);
              src = pvVar15;
              if (!bVar7) goto LAB_0062f7f8;
            }
            ZVar2 = (cctx->appliedParams).inBufferMode;
            if (ZVar2 == ZSTD_bm_buffered) {
              sVar14 = cctx->inBuffPos - cctx->inToCompress;
            }
            else {
              sVar14 = (long)pvVar10 - (long)src;
              if (cctx->blockSize <= (ulong)((long)pvVar10 - (long)src)) {
                sVar14 = cctx->blockSize;
              }
            }
            sVar11 = (long)pvVar4 + (sVar13 - (long)dst_00);
            uVar8 = -(sVar14 - 0x20000) >> 0xb;
            if (0x1ffff < sVar14) {
              uVar8 = 0;
            }
            dst = dst_00;
            if ((sVar11 < (sVar14 >> 8) + sVar14 + uVar8) &&
               ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
              sVar11 = cctx->outBuffSize;
              dst = cctx->outBuff;
            }
            if (ZVar2 == ZSTD_bm_buffered) {
              if (src == pvVar10 && endOp == ZSTD_e_end) {
                uVar8 = ZSTD_compressEnd(cctx,dst,sVar11,cctx->inBuff + cctx->inToCompress,sVar14);
              }
              else {
                uVar8 = ZSTD_compressContinue_internal
                                  (cctx,dst,sVar11,cctx->inBuff + cctx->inToCompress,sVar14,1,0);
              }
              iVar9 = 1;
              pvVar15 = src;
              if (uVar8 < 0xffffffffffffff89) {
                cctx->frameEnded = (uint)(src == pvVar10 && endOp == ZSTD_e_end);
                uVar12 = cctx->inBuffPos + cctx->blockSize;
                cctx->inBuffTarget = uVar12;
                if (cctx->inBuffSize < uVar12) {
                  cctx->inBuffPos = 0;
                  cctx->inBuffTarget = cctx->blockSize;
                }
                cctx->inToCompress = cctx->inBuffPos;
                goto LAB_0062f6fa;
              }
            }
            else {
              pvVar15 = (void *)((long)src + sVar14);
              if (pvVar15 == pvVar10) {
                uVar8 = ZSTD_compressEnd(cctx,dst,sVar11,src,sVar14);
              }
              else {
                uVar8 = ZSTD_compressContinue_internal(cctx,dst,sVar11,src,sVar14,1,0);
              }
              iVar9 = 1;
              if (uVar8 < 0xffffffffffffff89) {
                cctx->frameEnded = (uint)(pvVar15 == pvVar10);
                src = pvVar15;
LAB_0062f6fa:
                pvVar15 = src;
                if (dst == dst_00) {
                  dst_00 = dst_00 + uVar8;
                  iVar9 = 4;
                  uVar8 = local_80;
                  if (cctx->frameEnded != 0) {
                    cctx->streamStage = zcss_init;
                    cctx->pledgedSrcSizePlusOne = 0;
                    bVar17 = false;
                  }
                }
                else {
                  cctx->outBuffContentSize = uVar8;
                  cctx->outBuffFlushedSize = 0;
                  cctx->streamStage = zcss_flush;
                  iVar9 = 0;
                  uVar8 = local_80;
                }
              }
            }
            local_80 = uVar8;
            if (iVar9 != 4) {
              uVar8 = local_80;
              bVar7 = bVar17;
              if (iVar9 == 0) goto LAB_0062f75e;
              goto LAB_0062f869;
            }
          }
          else if (ZVar1 == zcss_flush) {
            bVar7 = true;
LAB_0062f75e:
            uVar12 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
            uVar16 = (long)pvVar4 + (sVar13 - (long)dst_00);
            uVar8 = uVar12;
            if (uVar16 < uVar12) {
              uVar8 = uVar16;
            }
            if (uVar8 != 0) {
              memcpy(dst_00,cctx->outBuff + cctx->outBuffFlushedSize,uVar8);
            }
            cctx->outBuffFlushedSize = cctx->outBuffFlushedSize + uVar8;
            dst_00 = dst_00 + uVar8;
            bVar17 = false;
            if (uVar12 <= uVar16) {
              cctx->outBuffContentSize = 0;
              cctx->outBuffFlushedSize = 0;
              if (cctx->frameEnded == 0) {
                cctx->streamStage = zcss_load;
                bVar17 = bVar7;
              }
              else {
                cctx->streamStage = zcss_init;
                cctx->pledgedSrcSizePlusOne = 0;
              }
            }
          }
          else {
            bVar17 = true;
            if (ZVar1 == zcss_init) {
              local_80 = 0xffffffffffffffc2;
              uVar8 = local_80;
              goto LAB_0062f869;
            }
          }
LAB_0062f7f8:
        } while (bVar17);
        input->pos = (long)pvVar15 - (long)pvVar3;
        output->pos = (long)dst_00 - (long)pvVar4;
        if (cctx->frameEnded == 0) {
          uVar8 = cctx->inBuffTarget - cctx->inBuffPos;
          if (uVar8 == 0) {
            uVar8 = cctx->blockSize;
          }
        }
        else {
          local_80 = 0;
          uVar8 = local_80;
        }
LAB_0062f869:
        local_80 = uVar8;
        sVar13 = local_80;
        if (local_80 < 0xffffffffffffff89) {
          if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
            (cctx->expectedInBuffer).pos = input->pos;
            sVar13 = input->size;
            (cctx->expectedInBuffer).src = input->src;
            (cctx->expectedInBuffer).size = sVar13;
          }
          if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
            cctx->expectedOutBufferSize = output->size - output->pos;
          }
          sVar13 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
        }
      }
    }
  }
  return sVar13;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, input->size), "CompressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);    /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}